

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  pointer pcVar1;
  bool bVar2;
  string url;
  string local_b8;
  undefined1 local_98 [48];
  string *local_68;
  AlphaNum local_60;
  
  bVar2 = ConsumeIdentifier(this,prefix);
  if (bVar2) {
    pcVar1 = local_98 + 0x10;
    local_68 = full_type_name;
    do {
      local_98._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,".","");
      bVar2 = TryConsume(this,(string *)local_98);
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      if (!bVar2) {
        local_98._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/","");
        bVar2 = Consume(this,(string *)local_98);
        if ((pointer)local_98._0_8_ != pcVar1) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        if (!bVar2) {
          return false;
        }
        local_98._0_8_ = (pointer)0x1;
        local_98._8_8_ = "/";
        absl::lts_20250127::StrAppend(prefix,(AlphaNum *)local_98);
        bVar2 = ConsumeFullTypeName(this,local_68);
        return bVar2;
      }
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      bVar2 = ConsumeIdentifier(this,&local_b8);
      if (bVar2) {
        local_98._0_8_ = (pointer)0x1;
        local_98._8_8_ = ".";
        local_60.piece_._M_len = local_b8._M_string_length;
        local_60.piece_._M_str = local_b8._M_dataplus._M_p;
        absl::lts_20250127::StrAppend(prefix,(AlphaNum *)local_98,&local_60);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar2);
  }
  return false;
}

Assistant:

bool ConsumeAnyTypeUrl(std::string* full_type_name, std::string* prefix) {
    // TODO Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    DO(ConsumeIdentifier(prefix));
    while (TryConsume(".")) {
      std::string url;
      DO(ConsumeIdentifier(&url));
      absl::StrAppend(prefix, ".", url);
    }
    DO(Consume("/"));
    absl::StrAppend(prefix, "/");
    DO(ConsumeFullTypeName(full_type_name));

    return true;
  }